

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::checkIfBecameIdle(RpcConnectionState *this)

{
  bool bVar1;
  Connection *pCVar2;
  bool local_c9;
  Connected *c;
  undefined1 local_b0 [8];
  Connected *_c876;
  Fault f_1;
  undefined1 local_98 [8];
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition_1;
  Fault local_60;
  Fault f;
  unsigned_long local_50;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  bool allTablesEmpty;
  RpcConnectionState *this_local;
  
  if ((this->idle & 1U) == 0) {
    bVar1 = anon_unknown_18::
            ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::empty
                      (&this->questions);
    local_c9 = false;
    if (bVar1) {
      bVar1 = anon_unknown_18::
              ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::empty
                        (&this->answers);
      local_c9 = false;
      if (bVar1) {
        bVar1 = anon_unknown_18::
                ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::
                empty(&this->exports);
        local_c9 = false;
        if (bVar1) {
          bVar1 = anon_unknown_18::
                  ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::
                  empty(&this->imports);
          local_c9 = false;
          if (bVar1) {
            local_c9 = anon_unknown_18::
                       ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>
                       ::empty(&this->embargoes);
          }
        }
      }
    }
    _kjCondition._39_1_ = local_c9;
    if (local_c9 != false) {
      local_50 = kj::HashMap<capnp::ClientHook_*,_unsigned_int>::size(&this->exportsByCap);
      local_48 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50);
      f.exception._4_4_ = 0;
      kj::_::DebugExpression<unsigned_long>::operator==
                ((DebugComparison<unsigned_long,_int> *)local_40,&local_48,
                 (int *)((long)&f.exception + 4));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
      if (!bVar1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                  (&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x367,FAILED,"exportsByCap.size() == 0","_kjCondition,",
                   (DebugComparison<unsigned_long,_int> *)local_40);
        kj::_::Debug::Fault::fatal(&local_60);
      }
      f_1.exception =
           (Exception *)
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->flowWaiter);
      kj::_::DebugExpression<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&>::
      operator==((DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
                  *)local_98,
                 (DebugExpression<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&>
                  *)&f_1,(None *)&kj::none);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&>
                  ((Fault *)&_c876,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x368,FAILED,"flowWaiter == kj::none","_kjCondition,",
                   (DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
                    *)local_98);
        kj::_::Debug::Fault::fatal((Fault *)&_c876);
      }
      this->idle = true;
      kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
      tryGet<capnp::_::RpcSystemBase::RpcConnectionState::Connected>
                ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception> *)&c)
      ;
      local_b0 = (undefined1  [8])
                 kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::Connected>
                           ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Connected_&> *)&c);
      if (local_b0 != (undefined1  [8])0x0) {
        pCVar2 = kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::operator->
                           (&((Connected *)local_b0)->connection);
        (*pCVar2->_vptr_Connection[5])(pCVar2,1);
      }
    }
  }
  return;
}

Assistant:

void checkIfBecameIdle() {
    // Checks if the connection has become idle, and if so, informs the VatNetwork by calling
    // setIdle(true). Generally, this must be called after erasing an entry from any of the
    // Four Tables.

    if (idle) return;  // already idle

    bool allTablesEmpty =
        questions.empty() && answers.empty() && exports.empty() && imports.empty() &&
        // Technically the embargoes table should always be empty if the others are, but it's not
        // expensive to check it.
        embargoes.empty();

    if (!allTablesEmpty) {
      // Not idle, don't do anything.
      return;
    }

    // Notes:
    // - `exportsByCap` is a reverse mapping of `exports` so should be empty if `exports` is empty.
    // - `tasks` only contains:
    //   (a) messageLoop()
    //   (b) instances of flowController->waitAllAcked(), which are meaningless if there are no
    //       calls outstanding, and
    //   (c) exceptions inserted specifically to break the connection
    //   Of these, only messageLoop() could cause the connection to become non-idle again, but
    //   that's a well-defined part of the setIdle() contract.
    // - `flowWaiter` is only non-null when a large number of calls are outstanding; if the tables
    //   are empty, it is null.
    //
    // Hence we know at this point that no further messages will be sent on this connection, unless
    // the app initiates a new bootstrap or a message is received. I.e., we are idle.

    KJ_ASSERT(exportsByCap.size() == 0);
    KJ_ASSERT(flowWaiter == kj::none);

    // OK, we can inform the VatNetwork of the idleness.
    idle = true;
    KJ_IF_SOME(c, connection.tryGet<Connected>()) {
      c.connection->setIdle(true);
    }
  }